

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  uint uVar1;
  uint extraout_EAX;
  Archive *archive;
  Texture2D *pTVar2;
  Vector<float,_4> local_13c;
  Sampler local_12c;
  TextureBinding local_f0 [2];
  int numTextures;
  bool isSupported;
  CompileFailed *anon_var_0;
  ShaderStructCase *local_10;
  ShaderStructCase *this_local;
  
  local_10 = this;
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  uVar1 = this->m_flags & 1;
  if (uVar1 != 0) {
    context = (this->super_ShaderRenderCase).m_renderCtx;
    contextInfo = (this->super_ShaderRenderCase).m_ctxInfo;
    archive = tcu::TestContext::getArchive
                        ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx);
    pTVar2 = glu::Texture2D::create(context,contextInfo,archive,"data/brick.png");
    this->m_brickTexture = pTVar2;
    pTVar2 = this->m_brickTexture;
    tcu::Vector<float,_4>::Vector(&local_13c,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (&local_12c,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,LINEAR,0.0,true,
               COMPAREMODE_NONE,0,&local_13c,false,MODE_DEPTH);
    deqp::gls::TextureBinding::TextureBinding(local_f0,pTVar2,&local_12c);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,local_f0);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void ShaderStructCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		if ((m_flags && FLAG_USES_TEXTURES) && m_isVertexCase)
		{
			int numTextures = 0;
			m_renderCtx.getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numTextures);
			if (numTextures == 0)
				throw tcu::NotSupportedError("Vertex shader texture access not supported");
		}

		if (m_flags & FLAG_REQUIRES_DYNAMIC_INDEXING)
			throw tcu::NotSupportedError("Dynamic indexing not supported");

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
}